

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall
Clasp::mt::LocalDistribution::publish(LocalDistribution *this,Solver *s,SharedLiterals *n)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  SharedLiterals *in_RDX;
  Solver *in_RSI;
  long in_RDI;
  LocalDistribution *unaff_retaddr;
  QNode *node;
  uint32 i;
  uint32 decRef;
  uint32 size;
  uint32 sender;
  uint32 n_00;
  QNode *in_stack_ffffffffffffffd0;
  uint32 uVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = in_RDI;
  uVar2 = Solver::id(in_RSI);
  uVar3 = SharedLiterals::size(in_RDX);
  iVar5 = 0;
  for (uVar4 = 0; n_00 = (uint32)((ulong)in_RDI >> 0x20), uVar4 != *(uint32 *)(in_RDI + 0x20);
      uVar4 = uVar4 + 1) {
    if (uVar4 != uVar2) {
      if ((uVar3 < 2) || (bVar1 = Distributor::inSet((uint64)in_stack_ffffffffffffffd0,n_00), bVar1)
         ) {
        in_stack_ffffffffffffffd0 =
             allocNode(unaff_retaddr,(uint32)((ulong)lVar6 >> 0x20),(SharedLiterals *)in_RSI);
        MPSCPtrQueue::push((MPSCPtrQueue *)CONCAT44(uVar2,uVar3),(Node *)CONCAT44(iVar5,uVar4));
      }
      else {
        iVar5 = iVar5 + 1;
      }
    }
  }
  if (iVar5 != 0) {
    SharedLiterals::release((SharedLiterals *)in_stack_ffffffffffffffd0,n_00);
  }
  return;
}

Assistant:

void LocalDistribution::publish(const Solver& s, SharedLiterals* n) {
	assert(n->refCount() >= (numThread_-1));
	uint32 sender = s.id();
	uint32 size   = n->size();
	uint32 decRef = 0;
	for (uint32 i = 0; i != numThread_; ++i) {
		if (i == sender) { continue; }
		if (size > 1 && !inSet(thread_[i]->peers, sender)) { ++decRef; }
		else {
			QNode* node = allocNode(sender, n);
			thread_[i]->received.push(node);
		}
	}
	if (decRef) { n->release(decRef); }
}